

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

void __thiscall zmq::context_t::context_t(context_t *this,int io_threads_,int max_sockets_)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  int rc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  lVar1 = zmq_ctx_new();
  *in_RDI = lVar1;
  if (*in_RDI == 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    error_t::error_t((error_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    __cxa_throw(uVar2,&error_t::typeinfo,error_t::~error_t);
  }
  zmq_ctx_set(*in_RDI,1,in_ESI);
  zmq_ctx_set(*in_RDI,2,in_EDX);
  return;
}

Assistant:

explicit context_t(int io_threads_,
                              int max_sockets_ = ZMQ_MAX_SOCKETS_DFLT)
    {
        ptr = zmq_ctx_new();
        if (ptr == ZMQ_NULLPTR)
            throw error_t();

        int rc = zmq_ctx_set(ptr, ZMQ_IO_THREADS, io_threads_);
        ZMQ_ASSERT(rc == 0);

        rc = zmq_ctx_set(ptr, ZMQ_MAX_SOCKETS, max_sockets_);
        ZMQ_ASSERT(rc == 0);
    }